

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O2

Status * __thiscall absl::lts_20250127::Status::operator=(Status *this,Status *x)

{
  uintptr_t rep;
  
  rep = this->rep_;
  if (x->rep_ != rep) {
    Ref(x->rep_);
    this->rep_ = x->rep_;
    Unref(rep);
  }
  return this;
}

Assistant:

inline Status& Status::operator=(const Status& x) {
  uintptr_t old_rep = rep_;
  if (x.rep_ != old_rep) {
    Ref(x.rep_);
    rep_ = x.rep_;
    Unref(old_rep);
  }
  return *this;
}